

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

string * node2name_abi_cxx11_(string *__return_storage_ptr__,CfgNode *node)

{
  char *pcVar1;
  char *pcVar2;
  stringstream ss;
  stringstream local_1a0 [16];
  long local_190 [3];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  if (node != (CfgNode *)0x0) {
    switch(node->m_type) {
    case CFG_ENTRY:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "entry";
      pcVar1 = "";
      break;
    case CFG_BLOCK:
    case CFG_PHANTOM:
      std::__cxx11::stringstream::stringstream(local_1a0);
      *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
           *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"0x",2);
      CfgNode::node2addr(node);
      std::ostream::_M_insert<unsigned_long>((ulong)local_190);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1a0);
      std::ios_base::~ios_base(local_120);
      return __return_storage_ptr__;
    case CFG_EXIT:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "exit";
      pcVar1 = "";
      break;
    case CFG_HALT:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "halt";
      pcVar1 = "";
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                    ,0x1b9,"std::string node2name(CfgNode *)");
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
    return __return_storage_ptr__;
  }
  __assert_fail("node != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                ,0x1aa,"std::string node2name(CfgNode *)");
}

Assistant:

static
std::string node2name(CfgNode* node) {
	assert(node != 0);
	switch (node->type()) {
		case CfgNode::CFG_ENTRY:
			return "entry";
		case CfgNode::CFG_PHANTOM:
		case CfgNode::CFG_BLOCK: {
			std::stringstream ss;
			ss << std::hex << "0x" << CfgNode::node2addr(node);
			return ss.str();
			} break;
		case CfgNode::CFG_EXIT:
			return "exit";
		case CfgNode::CFG_HALT:
			return "halt";
		default:
			assert(false);
	}
	return "";
}